

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O0

int __thiscall Process::yesOrNo(Process *this,double probability)

{
  result_type rVar1;
  result_type_conflict1 rVar2;
  result_type_conflict1 a;
  uniform_real_distribution<double> urd;
  undefined1 local_2728 [8];
  mt19937 mersenne;
  random_device rd;
  double probability_local;
  Process *this_local;
  
  yesOrNo::sum = yesOrNo::sum + probability;
  std::random_device::random_device((random_device *)&mersenne._M_p);
  rVar1 = std::random_device::operator()((random_device *)&mersenne._M_p);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)local_2728,(ulong)rVar1);
  std::uniform_real_distribution<double>::uniform_real_distribution
            ((uniform_real_distribution<double> *)&a,0.0,1.0);
  rVar2 = std::uniform_real_distribution<double>::operator()
                    ((uniform_real_distribution<double> *)&a,
                     (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                      *)local_2728);
  std::random_device::~random_device((random_device *)&mersenne._M_p);
  return (uint)(rVar2 <= probability);
}

Assistant:

int Process::yesOrNo(double probability){
    static double sum = 0;
    sum += probability;
    std::random_device rd;
    std::mt19937 mersenne(rd());
    std::uniform_real_distribution<> urd(0, 1);
    auto a = urd(mersenne);
    return a <= probability ? 1 : 0;
}